

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

bool __thiscall
capnp::compiler::NodeTranslator::compileType
          (NodeTranslator *this,Reader source,Builder target,ImplicitParams implicitMethodParams)

{
  bool bVar1;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_178;
  char local_c8;
  BrandedDecl local_c0;
  
  BrandScope::compileDeclExpression
            (&local_178,(this->localBrand).ptr,source,this->resolver,implicitMethodParams);
  local_c8 = local_178.ptr.isSet;
  if (local_178.ptr.isSet == true) {
    local_c0.body.tag = local_178.ptr.field_1.value.body.tag;
    if (local_178.ptr.field_1.value.body.tag == 2) {
      local_c0.body.field_1.forceAligned = (void *)local_178.ptr.field_1._8_8_;
      local_c0.body.field_1._8_8_ = local_178.ptr.field_1._16_8_;
    }
    else if (local_178.ptr.field_1.value.body.tag == 1) {
      local_c0.body.field_1._32_8_ = local_178.ptr.field_1._40_8_;
      local_c0.body.field_1._16_8_ = local_178.ptr.field_1._24_8_;
      local_c0.body.field_1._24_8_ = local_178.ptr.field_1._32_8_;
      local_c0.body.field_1.forceAligned = (void *)local_178.ptr.field_1._8_8_;
      local_c0.body.field_1._8_8_ = local_178.ptr.field_1._16_8_;
      local_c0.body.field_1.space[0x28] = local_178.ptr.field_1._48_1_;
      if (local_178.ptr.field_1._48_1_ == '\x01') {
        local_c0.body.field_1._80_8_ = local_178.ptr.field_1._88_8_;
        local_c0.body.field_1._88_8_ = local_178.ptr.field_1._96_8_;
        local_c0.body.field_1._64_8_ = local_178.ptr.field_1._72_8_;
        local_c0.body.field_1._72_8_ = local_178.ptr.field_1._80_8_;
        local_c0.body.field_1._48_8_ = local_178.ptr.field_1._56_8_;
        local_c0.body.field_1._56_8_ = local_178.ptr.field_1._64_8_;
      }
    }
    local_c0.brand.disposer = local_178.ptr.field_1.value.brand.disposer;
    local_c0.brand.ptr = local_178.ptr.field_1.value.brand.ptr;
    local_c0.source._reader.segment = local_178.ptr.field_1.value.source._reader.segment;
    local_c0.source._reader.capTable = local_178.ptr.field_1.value.source._reader.capTable;
    local_c0.source._reader.data = local_178.ptr.field_1.value.source._reader.data;
    local_c0.source._reader.pointers = local_178.ptr.field_1.value.source._reader.pointers;
    local_c0.source._reader.dataSize = local_178.ptr.field_1.value.source._reader.dataSize;
    local_c0.source._reader.pointerCount = local_178.ptr.field_1.value.source._reader.pointerCount;
    local_c0.source._reader._38_2_ = local_178.ptr.field_1._158_2_;
    local_c0.source._reader._40_8_ = local_178.ptr.field_1._160_8_;
    bVar1 = BrandedDecl::compileAsType(&local_c0,this->errorReporter,target);
    if (local_178.ptr.field_1.value.brand.ptr != (BrandScope *)0x0) {
      (**(local_178.ptr.field_1.value.brand.disposer)->_vptr_Disposer)
                (local_178.ptr.field_1.value.brand.disposer,
                 ((local_178.ptr.field_1.value.brand.ptr)->super_Refcounted).super_Disposer.
                 _vptr_Disposer[-2] +
                 (long)&((local_178.ptr.field_1.value.brand.ptr)->super_Refcounted).super_Disposer.
                        _vptr_Disposer);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool NodeTranslator::compileType(Expression::Reader source, schema::Type::Builder target,
                                 ImplicitParams implicitMethodParams) {
  KJ_IF_MAYBE(decl, compileDeclExpression(source, implicitMethodParams)) {
    return decl->compileAsType(errorReporter, target);
  } else {
    return false;
  }
}